

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O2

void __thiscall cmRST::OutputMarkupLines(cmRST *this,bool inlineMarkup)

{
  pointer pbVar1;
  string line;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (pbVar1 = (this->MarkupLines).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 != (this->MarkupLines).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar1 = pbVar1 + 1) {
    std::__cxx11::string::string((string *)&local_70,(string *)pbVar1);
    if (local_70._M_string_length != 0) {
      std::operator+(&local_50," ",&local_70);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    OutputLine(this,&local_70,inlineMarkup);
    std::__cxx11::string::~string((string *)&local_70);
  }
  this->OutputLinePending = true;
  return;
}

Assistant:

void cmRST::OutputMarkupLines(bool inlineMarkup)
{
  for (std::vector<std::string>::iterator i = this->MarkupLines.begin();
       i != this->MarkupLines.end(); ++i) {
    std::string line = *i;
    if (!line.empty()) {
      line = " " + line;
    }
    this->OutputLine(line, inlineMarkup);
  }
  this->OutputLinePending = true;
}